

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_7::NameApplier::OnBrTableExpr(NameApplier *this,BrTableExpr *expr)

{
  pointer pVVar1;
  Var *in_RCX;
  Var *target;
  pointer pVVar2;
  string_view sVar3;
  string_view sVar4;
  
  pVVar1 = (expr->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pVVar2 = (expr->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
                super__Vector_impl_data._M_start; pVVar2 != pVVar1; pVVar2 = pVVar2 + 1) {
    sVar3 = FindLabelByVar((NameApplier *)
                           (this->labels_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (Var *)(this->labels_).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
    sVar4.size_ = (size_type)pVVar2;
    sVar4.data_ = (char *)sVar3.size_;
    UseNameForVar((NameApplier *)sVar3.data_,sVar4,in_RCX);
  }
  sVar4 = FindLabelByVar((NameApplier *)
                         (this->labels_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (Var *)(this->labels_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
  sVar3.size_ = (size_type)&expr->default_target;
  sVar3.data_ = (char *)sVar4.size_;
  UseNameForVar((NameApplier *)sVar4.data_,sVar3,in_RCX);
  return (Result)Ok;
}

Assistant:

Result NameApplier::OnBrTableExpr(BrTableExpr* expr) {
  for (Var& target : expr->targets) {
    string_view label = FindLabelByVar(&target);
    UseNameForVar(label, &target);
  }

  string_view label = FindLabelByVar(&expr->default_target);
  UseNameForVar(label, &expr->default_target);
  return Result::Ok;
}